

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::LogicalType::LogicalType(LogicalType *this)

{
  _TimeUnit__isset *p_Var1;
  
  *(undefined ***)this = &PTR__LogicalType_019d7050;
  this->STRING = (StringType)&PTR__StringType_019d6900;
  this->MAP = (MapType)&PTR__MapType_019d69d0;
  this->LIST = (ListType)&PTR__ListType_019d6a38;
  this->ENUM = (EnumType)&PTR__EnumType_019d6aa0;
  *(undefined ***)&this->DECIMAL = &PTR__DecimalType_019d6c40;
  (this->DECIMAL).scale = 0;
  (this->DECIMAL).precision = 0;
  this->DATE = (DateType)&PTR__DateType_019d6b08;
  *(undefined ***)&this->TIME = &PTR__TimeType_019d6eb0;
  (this->TIME).isAdjustedToUTC = false;
  *(undefined ***)&(this->TIME).unit = &PTR__TimeUnit_019d6de0;
  (this->TIME).unit.MILLIS = (MilliSeconds)&PTR__MilliSeconds_019d6ca8;
  (this->TIME).unit.MICROS = (MicroSeconds)&PTR__MicroSeconds_019d6d10;
  (this->TIME).unit.NANOS = (NanoSeconds)&PTR__NanoSeconds_019d6d78;
  p_Var1 = &(this->TIME).unit.__isset;
  *p_Var1 = (_TimeUnit__isset)((byte)*p_Var1 & 0xf8);
  *(undefined ***)&this->TIMESTAMP = &PTR__TimestampType_019d6e48;
  (this->TIMESTAMP).isAdjustedToUTC = false;
  *(undefined ***)&(this->TIMESTAMP).unit = &PTR__TimeUnit_019d6de0;
  (this->TIMESTAMP).unit.MILLIS = (MilliSeconds)&PTR__MilliSeconds_019d6ca8;
  (this->TIMESTAMP).unit.MICROS = (MicroSeconds)&PTR__MicroSeconds_019d6d10;
  (this->TIMESTAMP).unit.NANOS = (NanoSeconds)&PTR__NanoSeconds_019d6d78;
  p_Var1 = &(this->TIMESTAMP).unit.__isset;
  *p_Var1 = (_TimeUnit__isset)((byte)*p_Var1 & 0xf8);
  *(undefined ***)&this->INTEGER = &PTR__IntType_019d6f18;
  (this->INTEGER).bitWidth = '\0';
  (this->INTEGER).isSigned = false;
  this->UNKNOWN = (NullType)&PTR__NullType_019d6bd8;
  this->JSON = (JsonType)&PTR__JsonType_019d6f80;
  this->BSON = (BsonType)&PTR__BsonType_019d6fe8;
  this->UUID = (UUIDType)&PTR__UUIDType_019d6968;
  this->FLOAT16 = (Float16Type)&PTR__Float16Type_019d6b70;
  this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xc000);
  return;
}

Assistant:

LogicalType::LogicalType() noexcept {
}